

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O1

void embree::avx512::InstanceArrayIntersector1MB::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  Geometry *pGVar1;
  RTCRayQueryContext *pRVar2;
  long *plVar3;
  long lVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined8 uVar6;
  bool bVar7;
  byte bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  _func_int *p_Var26;
  uint uVar27;
  uint uVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  uint uVar52;
  float fVar53;
  vfloat4 a0_2;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 in_ZMM0 [64];
  vfloat4 a0;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 in_ZMM1 [64];
  int iVar72;
  vfloat4 a0_1;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 in_ZMM2 [64];
  undefined4 uVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 in_ZMM4 [64];
  vfloat4 b0;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 in_ZMM5 [64];
  float fVar113;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 in_ZMM6 [64];
  float fVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 in_ZMM7 [64];
  vfloat4 a1;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  RayQueryContext newcontext;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 auStack_138 [16];
  undefined1 local_128 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  
  auVar34 = in_ZMM6._0_16_;
  auVar31 = in_ZMM4._0_16_;
  b0.field_0 = in_ZMM5._0_16_;
  a0.field_0 = in_ZMM1._0_16_;
  auVar30 = in_ZMM7._0_16_;
  a0_1.field_0 = in_ZMM2._0_16_;
  auVar36 = in_ZMM3._0_16_;
  a0_2.field_0 = in_ZMM0._0_16_;
  uVar52 = prim->primID_;
  pGVar1 = (context->scene->geometries).items[prim->instID_].ptr;
  p_Var26 = *(_func_int **)&pGVar1->field_0x58;
  if (p_Var26 == (_func_int *)0x0) {
    uVar22 = (ulong)*(uint *)(*(long *)&pGVar1[1].time_range.upper +
                             (long)pGVar1[1].intersectionFilterN * (ulong)uVar52);
    if (uVar22 == 0xffffffff) {
      p_Var26 = (_func_int *)0x0;
    }
    else {
      p_Var26 = pGVar1[1].super_RefCount._vptr_RefCount[uVar22];
    }
  }
  if (((p_Var26 != (_func_int *)0x0) && (((ray->super_RayK<1>).mask & pGVar1->mask) != 0)) &&
     (pRVar2 = context->user, pRVar2->instID[0] == 0xffffffff)) {
    pRVar2->instID[0] = prim->instID_;
    pRVar2->instPrimID[0] = uVar52;
    uVar22 = (ulong)prim->primID_;
    if (pGVar1->numTimeSteps == 1) {
      plVar3 = *(long **)&pGVar1[1].fnumTimeSegments;
      iVar72 = (int)plVar3[4];
      if ((pGVar1->field_8).field_0x1 == '\x01') {
        if (iVar72 == 0x9134) {
          lVar4 = *plVar3;
          lVar23 = uVar22 * plVar3[2];
          auVar36 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + lVar23)),
                                  ZEXT416(*(uint *)(lVar4 + 0x10 + lVar23)),0x1c);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar36,ZEXT416(*(uint *)(lVar4 + 0x20 + lVar23)),0x28);
          auVar36 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 4 + lVar23)),
                                  ZEXT416(*(uint *)(lVar4 + 0x14 + lVar23)),0x1c);
          auVar31 = vinsertps_avx(auVar36,ZEXT416(*(uint *)(lVar4 + 0x24 + lVar23)),0x28);
          auVar36 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 8 + lVar23)),
                                  ZEXT416(*(uint *)(lVar4 + 0x18 + lVar23)),0x1c);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar36,ZEXT416(*(uint *)(lVar4 + 0x28 + lVar23)),0x28);
          auVar36 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar23)),
                                  ZEXT416(*(uint *)(lVar4 + 0x1c + lVar23)),0x1c);
          auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)(lVar4 + 0x2c + lVar23)),0x28);
        }
        else if (iVar72 == 0x9234) {
          lVar4 = *plVar3;
          lVar23 = uVar22 * plVar3[2];
          auVar59._8_8_ = 0;
          auVar59._0_8_ = *(ulong *)(lVar4 + 4 + lVar23);
          auVar76._8_8_ = 0;
          auVar76._0_8_ = *(ulong *)(lVar4 + 0x10 + lVar23);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + lVar23)),_DAT_02060e80,auVar59);
          auVar31 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0xc + lVar23)),_DAT_02060e80,
                                       auVar76);
          auVar60._8_8_ = 0;
          auVar60._0_8_ = *(ulong *)(lVar4 + 0x1c + lVar23);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0x18 + lVar23)),_DAT_02060e80,
                                            auVar60);
          auVar61._8_8_ = 0;
          auVar61._0_8_ = *(ulong *)(lVar4 + 0x28 + lVar23);
          auVar36 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0x24 + lVar23)),_DAT_02060e80,
                                       auVar61);
        }
        else if (iVar72 == 0xb001) {
          lVar4 = *plVar3;
          lVar23 = uVar22 * plVar3[2];
          auVar62._8_8_ = 0;
          auVar62._0_8_ = *(ulong *)(lVar4 + 0x10 + lVar23);
          auVar34 = vinsertps_avx(auVar62,ZEXT416(*(uint *)(lVar4 + 8 + lVar23)),0x20);
          auVar66._8_8_ = 0;
          auVar66._0_8_ = *(ulong *)(lVar4 + 0x34 + lVar23);
          auVar30 = vpermt2ps_avx512vl(auVar66,_DAT_02060e90,ZEXT416(*(uint *)(lVar4 + lVar23)));
          auVar109._8_8_ = 0;
          auVar109._0_8_ = *(ulong *)(lVar4 + 0x1c + lVar23);
          fVar86 = *(float *)(lVar4 + 0x24 + lVar23);
          fVar53 = *(float *)(lVar4 + 0x28 + lVar23);
          fVar29 = *(float *)(lVar4 + 0x2c + lVar23);
          auVar31 = vpermt2ps_avx512vl(auVar109,_DAT_02060e90,
                                       ZEXT416(*(uint *)(lVar4 + 0x18 + lVar23)));
          fVar85 = *(float *)(lVar4 + 0x30 + lVar23);
          auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * fVar53)),ZEXT416((uint)fVar86),
                                    ZEXT416((uint)fVar86));
          auVar36 = vfmadd231ss_fma(auVar36,ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
          auVar36 = vfmadd231ss_fma(auVar36,ZEXT416((uint)fVar85),ZEXT416((uint)fVar85));
          auVar32 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar36._0_4_));
          fVar113 = auVar32._0_4_;
          fVar113 = fVar113 * 1.5 + fVar113 * fVar113 * fVar113 * auVar36._0_4_ * -0.5;
          auVar36 = vinsertps_avx(auVar31,ZEXT416((uint)(fVar113 * fVar86)),0x30);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar30,ZEXT416((uint)(fVar113 * fVar53)),0x30);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar34,ZEXT416((uint)(fVar113 * fVar85)),0x30);
          auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar23)),
                                  ZEXT416(*(uint *)(lVar4 + 4 + lVar23)),0x10);
          auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar4 + 0x3c + lVar23)),0x20);
          auVar31 = vinsertps_avx(auVar34,ZEXT416((uint)(fVar29 * fVar113)),0x30);
        }
        else if (iVar72 == 0x9244) {
          lVar4 = *plVar3;
          lVar23 = uVar22 * plVar3[2];
          a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar4 + lVar23))->v;
          auVar31 = *(undefined1 (*) [16])(lVar4 + 0x10 + lVar23);
          a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                          ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar4 + 0x20 + lVar23))
                          ->v;
          auVar36 = *(undefined1 (*) [16])(lVar4 + 0x30 + lVar23);
        }
        auVar30 = vshufps_avx(auVar36,auVar36,0xff);
        auVar32 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
        auVar39 = vshufps_avx(auVar31,auVar31,0xff);
        auVar33 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
        auVar34 = vshufps_avx((undefined1  [16])a0.field_0,ZEXT816(0) << 0x40,0xe9);
        auVar34 = vblendps_avx(auVar34,auVar31,4);
        fVar118 = auVar32._0_4_;
        auVar73 = vfmadd213ss_fma(auVar30,auVar30,ZEXT416((uint)(fVar118 * fVar118)));
        auVar73 = vfnmadd231ss_fma(auVar73,auVar39,auVar39);
        auVar35 = vfnmadd231ss_fma(auVar73,auVar33,auVar33);
        fVar113 = auVar30._0_4_;
        auVar37 = ZEXT416((uint)(auVar33._0_4_ * fVar113));
        auVar73 = vfmadd213ss_fma(auVar39,auVar32,auVar37);
        fVar86 = auVar73._0_4_ + auVar73._0_4_;
        auVar78 = ZEXT416((uint)(auVar39._0_4_ * fVar113));
        auVar73 = vfmsub213ss_fma(auVar33,auVar32,auVar78);
        fVar53 = auVar73._0_4_ + auVar73._0_4_;
        auVar73 = vfmsub231ss_fma(auVar37,auVar32,auVar39);
        fVar29 = auVar73._0_4_ + auVar73._0_4_;
        auVar73 = vfmsub231ss_fma(ZEXT416((uint)(fVar118 * fVar118)),auVar30,auVar30);
        auVar30 = vfmadd213ss_avx512f(auVar39,auVar39,auVar73);
        auVar37 = vfnmadd231ss_avx512f(auVar30,auVar33,auVar33);
        auVar30 = vfmadd213ss_avx512f(auVar33,auVar39,ZEXT416((uint)(fVar118 * fVar113)));
        auVar38 = vaddss_avx512f(auVar30,auVar30);
        auVar30 = vfmadd213ss_fma(auVar32,auVar33,auVar78);
        fVar85 = auVar30._0_4_ + auVar30._0_4_;
        auVar30 = vfmsub231ss_fma(ZEXT416((uint)(fVar118 * fVar113)),auVar39,auVar33);
        fVar113 = auVar30._0_4_ + auVar30._0_4_;
        auVar30 = vfnmadd231ss_fma(auVar73,auVar39,auVar39);
        auVar33 = vfmadd231ss_fma(auVar30,auVar33,auVar33);
        uVar84 = auVar35._0_4_;
        auVar126._4_4_ = uVar84;
        auVar126._0_4_ = uVar84;
        auVar126._8_4_ = uVar84;
        auVar126._12_4_ = uVar84;
        auVar132._4_4_ = fVar86;
        auVar132._0_4_ = fVar86;
        auVar132._8_4_ = fVar86;
        auVar132._12_4_ = fVar86;
        auVar135._0_4_ = fVar53 * 0.0;
        auVar135._4_4_ = fVar53 * 0.0;
        auVar135._8_4_ = fVar53 * 1.0;
        auVar135._12_4_ = fVar53 * 0.0;
        auVar73 = ZEXT816(0x3f80000000000000);
        auVar30 = vfmadd231ps_fma(auVar135,auVar73,auVar132);
        auVar35 = SUB6416(ZEXT464(0x3f800000),0);
        auVar32 = vfmadd231ps_fma(auVar30,auVar35,auVar126);
        auVar127._4_4_ = fVar29;
        auVar127._0_4_ = fVar29;
        auVar127._8_4_ = fVar29;
        auVar127._12_4_ = fVar29;
        auVar30 = vbroadcastss_avx512vl(auVar37);
        auVar39 = vbroadcastss_avx512vl(auVar38);
        auVar134._0_4_ = auVar39._0_4_ * 0.0;
        auVar134._4_4_ = auVar39._4_4_ * 0.0;
        auVar134._8_4_ = auVar39._8_4_ * 1.0;
        auVar134._12_4_ = auVar39._12_4_ * 0.0;
        auVar30 = vfmadd231ps_fma(auVar134,auVar73,auVar30);
        auVar39 = vfmadd231ps_fma(auVar30,auVar35,auVar127);
        auVar120._4_4_ = fVar85;
        auVar120._0_4_ = fVar85;
        auVar120._8_4_ = fVar85;
        auVar120._12_4_ = fVar85;
        auVar115._4_4_ = fVar113;
        auVar115._0_4_ = fVar113;
        auVar115._8_4_ = fVar113;
        auVar115._12_4_ = fVar113;
        fVar86 = auVar33._0_4_;
        auVar128._0_4_ = fVar86 * 0.0;
        auVar128._4_4_ = fVar86 * 0.0;
        auVar128._8_4_ = fVar86 * 1.0;
        auVar128._12_4_ = fVar86 * 0.0;
        auVar30 = vfmadd231ps_fma(auVar128,auVar73,auVar115);
        auVar30 = vfmadd231ps_fma(auVar30,auVar35,auVar120);
        auVar67._0_4_ = a0.field_0._0_4_;
        auVar67._4_4_ = auVar67._0_4_;
        auVar67._8_4_ = auVar67._0_4_;
        auVar67._12_4_ = auVar67._0_4_;
        fVar86 = auVar30._0_4_;
        auVar116._0_4_ = fVar86 * 0.0;
        fVar53 = auVar30._4_4_;
        auVar116._4_4_ = fVar53 * 0.0;
        fVar29 = auVar30._8_4_;
        auVar116._8_4_ = fVar29 * 0.0;
        fVar85 = auVar30._12_4_;
        auVar116._12_4_ = fVar85 * 0.0;
        auVar30 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar39,auVar116);
        a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vfmadd231ps_fma(auVar30,auVar32,auVar67);
        uVar84 = auVar31._0_4_;
        auVar121._4_4_ = uVar84;
        auVar121._0_4_ = uVar84;
        auVar121._8_4_ = uVar84;
        auVar121._12_4_ = uVar84;
        auVar30 = vshufps_avx(auVar31,auVar31,0x55);
        auVar30 = vfmadd213ps_fma(auVar30,auVar39,auVar116);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar30,auVar32,auVar121);
        iVar72 = a0_1.field_0._0_4_;
        auVar102._4_4_ = iVar72;
        auVar102._0_4_ = iVar72;
        auVar102._8_4_ = iVar72;
        auVar102._12_4_ = iVar72;
        auVar30 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0x55);
        auVar31 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xaa);
        auVar77._0_4_ = fVar86 * auVar31._0_4_;
        auVar77._4_4_ = fVar53 * auVar31._4_4_;
        auVar77._8_4_ = fVar29 * auVar31._8_4_;
        auVar77._12_4_ = fVar85 * auVar31._12_4_;
        auVar30 = vfmadd231ps_fma(auVar77,auVar39,auVar30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vfmadd231ps_fma(auVar30,auVar32,auVar102);
        uVar84 = auVar36._0_4_;
        auVar103._4_4_ = uVar84;
        auVar103._0_4_ = uVar84;
        auVar103._8_4_ = uVar84;
        auVar103._12_4_ = uVar84;
        auVar30 = vshufps_avx(auVar36,auVar36,0x55);
        auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
        auVar92._0_4_ = fVar86 * auVar36._0_4_;
        auVar92._4_4_ = fVar53 * auVar36._4_4_;
        auVar92._8_4_ = fVar29 * auVar36._8_4_;
        auVar92._12_4_ = fVar85 * auVar36._12_4_;
        auVar36 = vfmadd231ps_fma(auVar92,auVar39,auVar30);
        auVar30 = vfmadd231ps_fma(auVar36,auVar32,auVar103);
        auVar36._0_4_ = auVar34._0_4_ + 0.0 + auVar30._0_4_;
        auVar36._4_4_ = auVar34._4_4_ + 0.0 + auVar30._4_4_;
        auVar36._8_4_ = auVar34._8_4_ + 0.0 + auVar30._8_4_;
        auVar36._12_4_ = auVar34._12_4_ + 0.0 + auVar30._12_4_;
      }
      else if (iVar72 == 0x9134) {
        lVar4 = *plVar3;
        lVar23 = uVar22 * plVar3[2];
        auVar36 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + lVar23)),
                                ZEXT416(*(uint *)(lVar4 + 0x10 + lVar23)),0x1c);
        a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar36,ZEXT416(*(uint *)(lVar4 + 0x20 + lVar23)),0x28);
        auVar36 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 4 + lVar23)),
                                ZEXT416(*(uint *)(lVar4 + 0x14 + lVar23)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar36,ZEXT416(*(uint *)(lVar4 + 0x24 + lVar23)),0x28);
        auVar36 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 8 + lVar23)),
                                ZEXT416(*(uint *)(lVar4 + 0x18 + lVar23)),0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar36,ZEXT416(*(uint *)(lVar4 + 0x28 + lVar23)),0x28);
        auVar36 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar23)),
                                ZEXT416(*(uint *)(lVar4 + 0x1c + lVar23)),0x1c);
        auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)(lVar4 + 0x2c + lVar23)),0x28);
      }
      else if (iVar72 == 0x9234) {
        lVar4 = *plVar3;
        lVar23 = uVar22 * plVar3[2];
        auVar74._8_8_ = 0;
        auVar74._0_8_ = *(ulong *)(lVar4 + 4 + lVar23);
        auVar87._8_8_ = 0;
        auVar87._0_8_ = *(ulong *)(lVar4 + 0x10 + lVar23);
        a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + lVar23)),_DAT_02060e80,auVar74);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0xc + lVar23)),_DAT_02060e80,
                                        auVar87);
        auVar88._8_8_ = 0;
        auVar88._0_8_ = *(ulong *)(lVar4 + 0x1c + lVar23);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0x18 + lVar23)),_DAT_02060e80,
                                          auVar88);
        auVar104._8_8_ = 0;
        auVar104._0_8_ = *(ulong *)(lVar4 + 0x28 + lVar23);
        auVar36 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0x24 + lVar23)),_DAT_02060e80,
                                     auVar104);
      }
      else if (iVar72 == 0xb001) {
        lVar4 = *plVar3;
        lVar23 = uVar22 * plVar3[2];
        auVar54._8_8_ = 0;
        auVar54._0_8_ = *(ulong *)(lVar4 + 0x10 + lVar23);
        auVar34 = vinsertps_avx(auVar54,ZEXT416(*(uint *)(lVar4 + 8 + lVar23)),0x20);
        auVar55._8_8_ = 0;
        auVar55._0_8_ = *(ulong *)(lVar4 + 0x34 + lVar23);
        auVar30 = vpermt2ps_avx512vl(auVar55,_DAT_02060e90,ZEXT416(*(uint *)(lVar4 + lVar23)));
        auVar105._8_8_ = 0;
        auVar105._0_8_ = *(ulong *)(lVar4 + 0x1c + lVar23);
        fVar86 = *(float *)(lVar4 + 0x24 + lVar23);
        fVar53 = *(float *)(lVar4 + 0x28 + lVar23);
        fVar29 = *(float *)(lVar4 + 0x2c + lVar23);
        auVar31 = vpermt2ps_avx512vl(auVar105,_DAT_02060e90,
                                     ZEXT416(*(uint *)(lVar4 + 0x18 + lVar23)));
        fVar85 = *(float *)(lVar4 + 0x30 + lVar23);
        auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * fVar53)),ZEXT416((uint)fVar86),
                                  ZEXT416((uint)fVar86));
        auVar36 = vfmadd231ss_fma(auVar36,ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
        auVar36 = vfmadd231ss_fma(auVar36,ZEXT416((uint)fVar85),ZEXT416((uint)fVar85));
        auVar32 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar36._0_4_));
        fVar113 = auVar32._0_4_;
        fVar113 = fVar113 * 1.5 + fVar113 * fVar113 * fVar113 * auVar36._0_4_ * -0.5;
        auVar36 = vinsertps_avx(auVar31,ZEXT416((uint)(fVar113 * fVar86)),0x30);
        a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar30,ZEXT416((uint)(fVar113 * fVar53)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar34,ZEXT416((uint)(fVar113 * fVar85)),0x30);
        auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar23)),
                                ZEXT416(*(uint *)(lVar4 + 4 + lVar23)),0x10);
        auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar4 + 0x3c + lVar23)),0x20);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar34,ZEXT416((uint)(fVar29 * fVar113)),0x30);
      }
      else if (iVar72 == 0x9244) {
        lVar4 = *plVar3;
        lVar23 = uVar22 * plVar3[2];
        a0_2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar4 + lVar23))->v;
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar4 + 0x10 + lVar23))->v;
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar4 + 0x20 + lVar23))->
                        v;
        auVar36 = *(undefined1 (*) [16])(lVar4 + 0x30 + lVar23);
      }
    }
    else {
      fVar86 = (pGVar1->time_range).lower;
      fVar53 = (pGVar1->time_range).upper;
      auVar33 = ZEXT416((uint)fVar53);
      fVar86 = pGVar1->fnumTimeSegments *
               (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar86) / (fVar53 - fVar86));
      auVar36 = ZEXT416((uint)fVar86);
      auVar32 = vroundss_avx(ZEXT416((uint)fVar86),ZEXT416((uint)fVar86),9);
      auVar32 = vminss_avx(auVar32,ZEXT416((uint)(pGVar1->fnumTimeSegments + -1.0)));
      auVar39 = ZEXT816(0) << 0x20;
      auVar73 = SUB6416(ZEXT864(0),0) << 0x20;
      auVar32 = vmaxss_avx(auVar39,auVar32);
      fVar86 = fVar86 - auVar32._0_4_;
      iVar24 = (int)auVar32._0_4_;
      lVar4 = *(long *)&pGVar1[1].fnumTimeSegments;
      lVar23 = CONCAT44((int)((ulong)prim >> 0x20),iVar24) * 0x38;
      plVar3 = (long *)(lVar4 + lVar23);
      iVar72 = *(int *)(lVar4 + 0x20 + lVar23);
      if ((pGVar1->field_8).field_0x1 == '\x01') {
        auVar36 = ZEXT416((uint)fVar86);
        if (iVar72 == 0x9134) {
          lVar23 = *plVar3;
          lVar25 = plVar3[2] * uVar22;
          uVar52 = *(uint *)(lVar23 + 8 + lVar25);
          auVar73 = ZEXT416(uVar52);
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(lVar23 + lVar25)),
                                  ZEXT416(*(uint *)(lVar23 + 0x10 + lVar25)),0x1c);
          local_158 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(lVar23 + 0x20 + lVar25)),0x28);
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(lVar23 + 4 + lVar25)),
                                  ZEXT416(*(uint *)(lVar23 + 0x14 + lVar25)),0x1c);
          auStack_138 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(lVar23 + 0x24 + lVar25)),0x28);
          auVar30 = vinsertps_avx(ZEXT416(uVar52),ZEXT416(*(uint *)(lVar23 + 0x18 + lVar25)),0x1c);
          local_128 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(lVar23 + 0x28 + lVar25)),0x28);
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(lVar23 + 0xc + lVar25)),
                                  ZEXT416(*(uint *)(lVar23 + 0x1c + lVar25)),0x1c);
          local_168 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(lVar23 + 0x2c + lVar25)),0x28);
        }
        else if (iVar72 == 0x9234) {
          lVar23 = *plVar3;
          lVar25 = plVar3[2] * uVar22;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = *(ulong *)(lVar23 + 4 + lVar25);
          auVar31._8_8_ = 0;
          auVar31._0_8_ = *(ulong *)(lVar23 + 0x10 + lVar25);
          local_158 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar23 + lVar25)),_DAT_02060e80,auVar30);
          auVar31 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar23 + 0xc + lVar25)),_DAT_02060e80,
                                       auVar31);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = *(ulong *)(lVar23 + 0x1c + lVar25);
          local_128 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar23 + 0x18 + lVar25)),_DAT_02060e80,
                                         auVar32);
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)(lVar23 + 0x28 + lVar25);
          auVar73 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar23 + 0x24 + lVar25)),_DAT_02060e80,
                                       auVar39);
          local_168 = auVar73;
          auStack_138 = auVar31;
        }
        else if (iVar72 == 0xb001) {
          lVar23 = *plVar3;
          lVar25 = plVar3[2] * uVar22;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *(ulong *)(lVar23 + 0x10 + lVar25);
          auVar30 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar23 + 8 + lVar25)),0x20);
          auVar33._8_8_ = 0;
          auVar33._0_8_ = *(ulong *)(lVar23 + 0x34 + lVar25);
          uVar52 = *(uint *)(lVar23 + 0xc + lVar25);
          auVar31 = ZEXT416(uVar52);
          auVar32 = vpermt2ps_avx512vl(auVar33,_DAT_02060e90,ZEXT416(*(uint *)(lVar23 + lVar25)));
          auVar73._8_8_ = 0;
          auVar73._0_8_ = *(ulong *)(lVar23 + 0x1c + lVar25);
          fVar53 = *(float *)(lVar23 + 0x24 + lVar25);
          fVar29 = *(float *)(lVar23 + 0x28 + lVar25);
          fVar85 = *(float *)(lVar23 + 0x2c + lVar25);
          auVar39 = vpermt2ps_avx512vl(auVar73,_DAT_02060e90,
                                       ZEXT416(*(uint *)(lVar23 + 0x18 + lVar25)));
          fVar113 = *(float *)(lVar23 + 0x30 + lVar25);
          auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar29)),ZEXT416((uint)fVar53),
                                    ZEXT416((uint)fVar53));
          auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar85),ZEXT416((uint)fVar85));
          auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar113),ZEXT416((uint)fVar113));
          auVar33 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar34._0_4_));
          fVar118 = auVar33._0_4_;
          fVar118 = fVar118 * 1.5 + fVar118 * fVar118 * fVar118 * auVar34._0_4_ * -0.5;
          auVar34 = ZEXT416((uint)(fVar53 * fVar118));
          local_168 = vinsertps_avx(auVar39,ZEXT416((uint)(fVar53 * fVar118)),0x30);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       ZEXT416((uint)(fVar29 * fVar118));
          local_158 = vinsertps_avx(auVar32,ZEXT416((uint)(fVar29 * fVar118)),0x30);
          auVar73 = ZEXT416((uint)(fVar113 * fVar118));
          local_128 = vinsertps_avx(auVar30,ZEXT416((uint)(fVar113 * fVar118)),0x30);
          auVar30 = vinsertps_avx(ZEXT416(uVar52),ZEXT416(*(uint *)(lVar23 + 4 + lVar25)),0x10);
          auVar30 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(lVar23 + 0x3c + lVar25)),0x20);
          auStack_138 = vinsertps_avx(auVar30,ZEXT416((uint)(fVar85 * fVar118)),0x30);
        }
        else if (iVar72 == 0x9244) {
          lVar23 = *plVar3;
          lVar25 = plVar3[2] * uVar22;
          local_158 = *(undefined1 (*) [16])(lVar23 + lVar25);
          auStack_138 = *(undefined1 (*) [16])(lVar23 + 0x10 + lVar25);
          local_128 = *(undefined1 (*) [16])(lVar23 + 0x20 + lVar25);
          local_168 = *(undefined1 (*) [16])(lVar23 + 0x30 + lVar25);
        }
        lVar23 = (ulong)(iVar24 + 1) * 0x38;
        plVar3 = (long *)(lVar4 + lVar23);
        iVar72 = *(int *)(lVar4 + 0x20 + lVar23);
        if (iVar72 == 0x9134) {
          lVar4 = *plVar3;
          lVar23 = uVar22 * plVar3[2];
          auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + lVar23)),
                                  ZEXT416(*(uint *)(lVar4 + 0x10 + lVar23)),0x1c);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar4 + 0x20 + lVar23)),0x28);
          auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 4 + lVar23)),
                                  ZEXT416(*(uint *)(lVar4 + 0x14 + lVar23)),0x1c);
          auVar31 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar4 + 0x24 + lVar23)),0x28);
          auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 8 + lVar23)),
                                  ZEXT416(*(uint *)(lVar4 + 0x18 + lVar23)),0x1c);
          auVar73 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar4 + 0x28 + lVar23)),0x28);
          auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar23)),
                                  ZEXT416(*(uint *)(lVar4 + 0x1c + lVar23)),0x1c);
          auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar4 + 0x2c + lVar23)),0x28);
        }
        else if (iVar72 == 0x9234) {
          lVar4 = *plVar3;
          lVar23 = uVar22 * plVar3[2];
          auVar35._8_8_ = 0;
          auVar35._0_8_ = *(ulong *)(lVar4 + 4 + lVar23);
          auVar78._8_8_ = 0;
          auVar78._0_8_ = *(ulong *)(lVar4 + 0x10 + lVar23);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + lVar23)),_DAT_02060e80,auVar35);
          auVar31 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0xc + lVar23)),_DAT_02060e80,
                                       auVar78);
          auVar37._8_8_ = 0;
          auVar37._0_8_ = *(ulong *)(lVar4 + 0x1c + lVar23);
          auVar73 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0x18 + lVar23)),_DAT_02060e80,
                                       auVar37);
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *(ulong *)(lVar4 + 0x28 + lVar23);
          auVar34 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0x24 + lVar23)),_DAT_02060e80,
                                       auVar38);
        }
        else if (iVar72 == 0xb001) {
          lVar4 = *plVar3;
          lVar23 = uVar22 * plVar3[2];
          auVar45._8_8_ = 0;
          auVar45._0_8_ = *(ulong *)(lVar4 + 0x10 + lVar23);
          auVar30 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar4 + 8 + lVar23)),0x20);
          auVar46._8_8_ = 0;
          auVar46._0_8_ = *(ulong *)(lVar4 + 0x34 + lVar23);
          auVar31 = vpermt2ps_avx512vl(auVar46,_DAT_02060e90,ZEXT416(*(uint *)(lVar4 + lVar23)));
          auVar47._8_8_ = 0;
          auVar47._0_8_ = *(ulong *)(lVar4 + 0x1c + lVar23);
          fVar53 = *(float *)(lVar4 + 0x24 + lVar23);
          fVar29 = *(float *)(lVar4 + 0x28 + lVar23);
          fVar85 = *(float *)(lVar4 + 0x2c + lVar23);
          auVar32 = vpermt2ps_avx512vl(auVar47,_DAT_02060e90,
                                       ZEXT416(*(uint *)(lVar4 + 0x18 + lVar23)));
          fVar113 = *(float *)(lVar4 + 0x30 + lVar23);
          auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar29)),ZEXT416((uint)fVar53),
                                    ZEXT416((uint)fVar53));
          auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar85),ZEXT416((uint)fVar85));
          auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar113),ZEXT416((uint)fVar113));
          auVar63._4_12_ = ZEXT812(0) << 0x20;
          auVar63._0_4_ = auVar34._0_4_;
          auVar39 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar63);
          fVar118 = auVar39._0_4_;
          fVar118 = fVar118 * 1.5 + fVar118 * fVar118 * fVar118 * auVar34._0_4_ * -0.5;
          auVar34 = vinsertps_avx(auVar32,ZEXT416((uint)(fVar53 * fVar118)),0x30);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar31,ZEXT416((uint)(fVar29 * fVar118)),0x30);
          auVar73 = vinsertps_avx(auVar30,ZEXT416((uint)(fVar113 * fVar118)),0x30);
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar23)),
                                  ZEXT416(*(uint *)(lVar4 + 4 + lVar23)),0x10);
          auVar30 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(lVar4 + 0x3c + lVar23)),0x20);
          auVar31 = vinsertps_avx(auVar30,ZEXT416((uint)(fVar85 * fVar118)),0x30);
        }
        else if (iVar72 == 0x9244) {
          lVar4 = *plVar3;
          lVar23 = uVar22 * plVar3[2];
          b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar4 + lVar23))->v;
          auVar31 = *(undefined1 (*) [16])(lVar4 + 0x10 + lVar23);
          auVar73 = *(undefined1 (*) [16])(lVar4 + 0x20 + lVar23);
          auVar34 = *(undefined1 (*) [16])(lVar4 + 0x30 + lVar23);
        }
        auVar35 = vpermilps_avx(local_168,0xff);
        auVar37 = vpermilps_avx(local_158,0xff);
        auVar38 = vpermilps_avx(auStack_138,0xff);
        auVar78 = vpermilps_avx(local_128,0xff);
        auVar30 = vshufps_avx(auVar34,auVar34,0xff);
        auVar32 = vshufps_avx((undefined1  [16])b0.field_0,(undefined1  [16])b0.field_0,0xff);
        auVar39 = vshufps_avx(auVar31,auVar31,0xff);
        auVar33 = vshufps_avx(auVar73,auVar73,0xff);
        fVar53 = auVar32._0_4_;
        auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * auVar37._0_4_)),auVar30,auVar35);
        auVar45 = vfmadd231ss_fma(auVar45,auVar39,auVar38);
        auVar45 = vfmadd231ss_fma(auVar45,auVar33,auVar78);
        auVar68._0_8_ = auVar45._0_8_ ^ 0x8000000080000000;
        auVar68._8_4_ = auVar45._8_4_ ^ 0x80000000;
        auVar68._12_4_ = auVar45._12_4_ ^ 0x80000000;
        bVar7 = auVar45._0_4_ < -auVar45._0_4_;
        auVar40._4_12_ = auVar30._4_12_;
        auVar40._0_4_ = (uint)bVar7 * (auVar30._0_4_ ^ 0x80000000) + (uint)!bVar7 * auVar30._0_4_;
        auVar41._4_12_ = auVar32._4_12_;
        auVar41._0_4_ = (uint)bVar7 * (int)-fVar53 + (uint)!bVar7 * (int)fVar53;
        auVar42._4_12_ = auVar39._4_12_;
        auVar42._0_4_ = (uint)bVar7 * (auVar39._0_4_ ^ 0x80000000) + (uint)!bVar7 * auVar39._0_4_;
        auVar43._4_12_ = auVar33._4_12_;
        auVar43._0_4_ = (uint)bVar7 * (auVar33._0_4_ ^ 0x80000000) + (uint)!bVar7 * auVar33._0_4_;
        auVar16._8_4_ = 0x7fffffff;
        auVar16._0_8_ = 0x7fffffff7fffffff;
        auVar16._12_4_ = 0x7fffffff;
        auVar39 = vandps_avx512vl(auVar45,auVar16);
        auVar30 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbb8d3753),0),auVar39,ZEXT416(0x3c9df1b8));
        auVar30 = vfmadd213ss_fma(auVar30,auVar39,ZEXT416(0xbd37e81c));
        auVar30 = vfmadd213ss_fma(auVar30,auVar39,ZEXT416(0x3db3edac));
        auVar30 = vfmadd213ss_fma(auVar30,auVar39,ZEXT416(0xbe5ba881));
        auVar32 = vfmadd213ss_fma(auVar30,auVar39,ZEXT416(0x3fc90fd1));
        auVar30 = vmaxss_avx(auVar68,auVar45);
        uVar52 = auVar30._0_4_;
        fVar53 = 1.0 - auVar39._0_4_;
        if (fVar53 < 0.0) {
          fVar53 = sqrtf(fVar53);
        }
        else {
          auVar30 = vsqrtss_avx(ZEXT416((uint)fVar53),ZEXT416((uint)fVar53));
          fVar53 = auVar30._0_4_;
        }
        auVar30 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(1.5707964 - fVar53 * auVar32._0_4_)))
        ;
        uVar6 = vcmpss_avx512f(ZEXT416(uVar52),ZEXT816(0) << 0x40,1);
        bVar7 = (bool)((byte)uVar6 & 1);
        uVar6 = vcmpss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)auVar39._0_4_),1);
        bVar9 = (bool)((byte)uVar6 & 1);
        fVar53 = fVar86 * (float)((uint)bVar9 * 0x7fc00000 +
                                 (uint)!bVar9 *
                                 (int)(1.5707964 -
                                      (float)((uint)bVar7 * (auVar30._0_4_ ^ 0x80000000) +
                                             (uint)!bVar7 * auVar30._0_4_)));
        auVar30 = ZEXT416((uint)(fVar53 * 0.63661975));
        auVar30 = vroundss_avx(auVar30,auVar30,9);
        auVar32 = vfnmadd213ss_fma(SUB6416(ZEXT464(0x3fc90fdb),0),auVar30,ZEXT416((uint)fVar53));
        uVar20 = (int)auVar30._0_4_ & 3;
        uVar21 = uVar20 - 1;
        fVar29 = auVar32._0_4_;
        fVar53 = fVar29 * fVar29;
        auVar32 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb2d70013),0),ZEXT416((uint)fVar53),
                                  ZEXT416(0x363938a8));
        auVar39 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb48b634d),0),ZEXT416((uint)fVar53),
                                  ZEXT416(0x37cfab9c));
        auVar33 = ZEXT416((uint)fVar53);
        auVar32 = vfmadd213ss_fma(auVar32,auVar33,ZEXT416(0xb9501096));
        auVar39 = vfmadd213ss_fma(auVar39,auVar33,ZEXT416(0xbab60981));
        auVar32 = vfmadd213ss_fma(auVar32,auVar33,ZEXT416(0x3c088898));
        auVar39 = vfmadd213ss_fma(auVar39,auVar33,ZEXT416(0x3d2aaaa4));
        auVar33 = ZEXT416((uint)fVar53);
        auVar32 = vfmadd213ss_fma(auVar32,auVar33,ZEXT416(0xbe2aaaab));
        auVar39 = vfmadd213ss_fma(auVar39,auVar33,SUB6416(ZEXT464(0xbf000000),0));
        auVar32 = vfmadd213ss_avx512f(auVar32,auVar33,ZEXT416(0x3f800000));
        auVar39 = vfmadd213ss_avx512f(auVar39,auVar33,ZEXT416(0x3f800000));
        fVar29 = fVar29 * auVar32._0_4_;
        bVar8 = (byte)(int)auVar30._0_4_;
        uVar27 = (uint)(bVar8 & 1) * auVar39._0_4_ + (uint)!(bool)(bVar8 & 1) * (int)fVar29;
        auVar44._4_12_ = auVar39._4_12_;
        uVar28 = (uint)(bVar8 & 1) * (int)fVar29 + (uint)!(bool)(bVar8 & 1) * auVar39._0_4_;
        fVar29 = (float)((uint)(1 < uVar20) * (uVar27 ^ 0x80000000) + (1 >= uVar20) * uVar27);
        auVar44._0_4_ = (uint)(uVar21 < 2) * (uVar28 ^ 0x80000000) + (uVar21 >= 2) * uVar28;
        auVar32 = vfmsub213ss_avx512f(auVar35,ZEXT416(uVar52),auVar40);
        auVar39 = ZEXT416(uVar52);
        auVar30 = vfmsub213ss_avx512f(auVar37,auVar39,auVar41);
        auVar33 = vfmsub213ss_avx512f(auVar38,auVar39,auVar42);
        auVar45 = vfmsub213ss_avx512f(auVar78,auVar39,auVar43);
        fVar85 = auVar30._0_4_;
        auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar85 * fVar85)),auVar32,auVar32);
        auVar30 = vfmadd231ss_fma(auVar30,auVar33,auVar33);
        auVar30 = vfmadd231ss_fma(auVar30,auVar45,auVar45);
        auVar63 = ZEXT816(0) << 0x20;
        auVar39 = vrsqrt14ss_avx512f(auVar63,ZEXT416((uint)auVar30._0_4_));
        fVar53 = auVar39._0_4_;
        fVar53 = fVar53 * 1.5 + fVar53 * fVar53 * fVar53 * auVar30._0_4_ * -0.5;
        auVar46 = vfmsub231ss_avx512f(ZEXT416((uint)(fVar53 * auVar32._0_4_ * fVar29)),auVar44,
                                      auVar35);
        auVar39 = vfmsub231ss_fma(ZEXT416((uint)(fVar53 * fVar85 * fVar29)),auVar44,auVar37);
        auVar33 = vfmsub231ss_fma(ZEXT416((uint)(fVar53 * auVar33._0_4_ * fVar29)),auVar44,auVar38);
        auVar45 = vfmsub231ss_fma(ZEXT416((uint)(fVar53 * auVar45._0_4_ * fVar29)),auVar78,auVar44);
        auVar47 = vsubss_avx512f(ZEXT416(0x3f800000),auVar36);
        auVar30 = vmulss_avx512f(auVar36,auVar40);
        auVar35 = vfmadd231ss_avx512f(auVar30,auVar47,auVar35);
        auVar30 = vmulss_avx512f(auVar36,auVar41);
        auVar30 = vfmadd231ss_fma(auVar30,auVar47,auVar37);
        auVar32 = vmulss_avx512f(auVar36,auVar42);
        auVar32 = vfmadd231ss_fma(auVar32,auVar47,auVar38);
        auVar36 = vmulss_avx512f(auVar36,auVar43);
        auVar36 = vfmadd231ss_fma(auVar36,auVar47,auVar78);
        fVar29 = auVar30._0_4_;
        auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar29)),auVar35,auVar35);
        auVar30 = vfmadd231ss_fma(auVar30,auVar32,auVar32);
        auVar30 = vfmadd231ss_fma(auVar30,auVar36,auVar36);
        auVar37 = vrsqrt14ss_avx512f(auVar63,ZEXT416((uint)auVar30._0_4_));
        fVar53 = auVar37._0_4_;
        fVar53 = fVar53 * 1.5 + fVar53 * fVar53 * fVar53 * auVar30._0_4_ * -0.5;
        vucomiss_avx512f(ZEXT416(0x3f7fdf3b));
        bVar7 = 2 < uVar21;
        auVar48._4_12_ = auVar46._4_12_;
        auVar48._0_4_ =
             (float)((uint)bVar7 * (int)(auVar35._0_4_ * fVar53) + (uint)!bVar7 * auVar46._0_4_);
        auVar49._4_12_ = auVar39._4_12_;
        auVar49._0_4_ = (float)((uint)bVar7 * (int)(fVar29 * fVar53) + (uint)!bVar7 * auVar39._0_4_)
        ;
        auVar50._4_12_ = auVar33._4_12_;
        auVar50._0_4_ =
             (float)((uint)bVar7 * (int)(auVar32._0_4_ * fVar53) + (uint)!bVar7 * auVar33._0_4_);
        auVar51._4_12_ = auVar45._4_12_;
        auVar51._0_4_ =
             (float)((uint)bVar7 * (int)(auVar36._0_4_ * fVar53) + (uint)!bVar7 * auVar45._0_4_);
        local_58 = b0.field_0._0_4_;
        fStack_54 = b0.field_0._4_4_;
        fStack_50 = b0.field_0._8_4_;
        fStack_4c = b0.field_0._12_4_;
        auVar122._0_4_ = fVar86 * local_58;
        auVar122._4_4_ = fVar86 * fStack_54;
        auVar122._8_4_ = fVar86 * fStack_50;
        auVar122._12_4_ = fVar86 * fStack_4c;
        auVar117._0_4_ = auVar47._0_4_;
        auVar117._4_4_ = auVar117._0_4_;
        auVar117._8_4_ = auVar117._0_4_;
        auVar117._12_4_ = auVar117._0_4_;
        auVar35 = vfmadd213ps_avx512vl(local_158,auVar117,auVar122);
        local_68 = auVar31._0_4_;
        fStack_64 = auVar31._4_4_;
        fStack_60 = auVar31._8_4_;
        fStack_5c = auVar31._12_4_;
        auVar123._0_4_ = fVar86 * local_68;
        auVar123._4_4_ = fVar86 * fStack_64;
        auVar123._8_4_ = fVar86 * fStack_60;
        auVar123._12_4_ = fVar86 * fStack_5c;
        auVar36 = vfmadd213ps_fma(auStack_138,auVar117,auVar123);
        local_78 = auVar73._0_4_;
        fStack_74 = auVar73._4_4_;
        fStack_70 = auVar73._8_4_;
        fStack_6c = auVar73._12_4_;
        auVar124._0_4_ = fVar86 * local_78;
        auVar124._4_4_ = fVar86 * fStack_74;
        auVar124._8_4_ = fVar86 * fStack_70;
        auVar124._12_4_ = fVar86 * fStack_6c;
        auVar37 = vfmadd213ps_avx512vl(local_128,auVar117,auVar124);
        local_88 = auVar34._0_4_;
        fStack_84 = auVar34._4_4_;
        fStack_80 = auVar34._8_4_;
        fStack_7c = auVar34._12_4_;
        auVar110._0_4_ = fVar86 * local_88;
        auVar110._4_4_ = fVar86 * fStack_84;
        auVar110._8_4_ = fVar86 * fStack_80;
        auVar110._12_4_ = fVar86 * fStack_7c;
        auVar30 = vfmadd213ps_fma(local_168,auVar117,auVar110);
        auVar34 = vshufps_avx512vl(auVar35,auVar63,0xe9);
        auVar34 = vblendps_avx(auVar34,auVar36,4);
        auVar31 = vfmadd213ss_fma(auVar48,auVar48,ZEXT416((uint)(auVar49._0_4_ * auVar49._0_4_)));
        auVar31 = vfnmadd231ss_fma(auVar31,auVar50,auVar50);
        auVar39 = vfnmadd231ss_fma(auVar31,auVar51,auVar51);
        auVar31 = vfmadd213ss_fma(auVar50,auVar49,ZEXT416((uint)(auVar48._0_4_ * auVar51._0_4_)));
        fVar86 = auVar31._0_4_ + auVar31._0_4_;
        auVar31 = vfmsub213ss_fma(auVar51,auVar49,ZEXT416((uint)(auVar48._0_4_ * auVar50._0_4_)));
        fVar53 = auVar31._0_4_ + auVar31._0_4_;
        auVar31 = vfmsub231ss_fma(ZEXT416((uint)(auVar48._0_4_ * auVar51._0_4_)),auVar49,auVar50);
        fVar29 = auVar31._0_4_ + auVar31._0_4_;
        auVar32 = vfmsub231ss_fma(ZEXT416((uint)(auVar49._0_4_ * auVar49._0_4_)),auVar48,auVar48);
        auVar31 = vfmadd213ss_fma(auVar50,auVar50,auVar32);
        auVar73 = vfnmadd231ss_fma(auVar31,auVar51,auVar51);
        auVar31 = vfmadd213ss_fma(auVar51,auVar50,ZEXT416((uint)(auVar48._0_4_ * auVar49._0_4_)));
        fVar85 = auVar31._0_4_ + auVar31._0_4_;
        auVar31 = vfmadd213ss_fma(auVar49,auVar51,ZEXT416((uint)(auVar48._0_4_ * auVar50._0_4_)));
        fVar113 = auVar31._0_4_ + auVar31._0_4_;
        auVar31 = vfmsub231ss_fma(ZEXT416((uint)(auVar48._0_4_ * auVar49._0_4_)),auVar50,auVar51);
        fVar118 = auVar31._0_4_ + auVar31._0_4_;
        auVar31 = vfnmadd231ss_fma(auVar32,auVar50,auVar50);
        auVar33 = vfmadd231ss_fma(auVar31,auVar51,auVar51);
        uVar84 = auVar39._0_4_;
        auVar69._4_4_ = uVar84;
        auVar69._0_4_ = uVar84;
        auVar69._8_4_ = uVar84;
        auVar69._12_4_ = uVar84;
        auVar79._4_4_ = fVar86;
        auVar79._0_4_ = fVar86;
        auVar79._8_4_ = fVar86;
        auVar79._12_4_ = fVar86;
        auVar133._0_4_ = fVar53 * 0.0;
        auVar133._4_4_ = fVar53 * 0.0;
        auVar133._8_4_ = fVar53 * 1.0;
        auVar133._12_4_ = fVar53 * 0.0;
        auVar38 = ZEXT816(0x3f80000000000000);
        auVar31 = vfmadd231ps_fma(auVar133,auVar38,auVar79);
        auVar78 = SUB6416(ZEXT464(0x3f800000),0);
        auVar32 = vfmadd231ps_fma(auVar31,auVar78,auVar69);
        auVar70._4_4_ = fVar29;
        auVar70._0_4_ = fVar29;
        auVar70._8_4_ = fVar29;
        auVar70._12_4_ = fVar29;
        uVar84 = auVar73._0_4_;
        auVar80._4_4_ = uVar84;
        auVar80._0_4_ = uVar84;
        auVar80._8_4_ = uVar84;
        auVar80._12_4_ = uVar84;
        auVar129._0_4_ = fVar85 * 0.0;
        auVar129._4_4_ = fVar85 * 0.0;
        auVar129._8_4_ = fVar85 * 1.0;
        auVar129._12_4_ = fVar85 * 0.0;
        auVar31 = vfmadd231ps_fma(auVar129,auVar38,auVar80);
        auVar39 = vfmadd231ps_fma(auVar31,auVar78,auVar70);
        auVar71._4_4_ = fVar113;
        auVar71._0_4_ = fVar113;
        auVar71._8_4_ = fVar113;
        auVar71._12_4_ = fVar113;
        auVar81._4_4_ = fVar118;
        auVar81._0_4_ = fVar118;
        auVar81._8_4_ = fVar118;
        auVar81._12_4_ = fVar118;
        fVar86 = auVar33._0_4_;
        auVar93._0_4_ = fVar86 * 0.0;
        auVar93._4_4_ = fVar86 * 0.0;
        auVar93._8_4_ = fVar86 * 1.0;
        auVar93._12_4_ = fVar86 * 0.0;
        auVar31 = vfmadd231ps_fma(auVar93,auVar38,auVar81);
        auVar31 = vfmadd231ps_fma(auVar31,auVar78,auVar71);
        auVar33 = vbroadcastss_avx512vl(auVar35);
        fVar86 = auVar31._0_4_;
        auVar82._0_4_ = fVar86 * 0.0;
        fVar53 = auVar31._4_4_;
        auVar82._4_4_ = fVar53 * 0.0;
        fVar29 = auVar31._8_4_;
        auVar82._8_4_ = fVar29 * 0.0;
        fVar85 = auVar31._12_4_;
        auVar82._12_4_ = fVar85 * 0.0;
        auVar31 = vfmadd213ps_fma(auVar63,auVar39,auVar82);
        a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vfmadd231ps_fma(auVar31,auVar32,auVar33);
        uVar84 = auVar36._0_4_;
        auVar111._4_4_ = uVar84;
        auVar111._0_4_ = uVar84;
        auVar111._8_4_ = uVar84;
        auVar111._12_4_ = uVar84;
        auVar36 = vshufps_avx(auVar36,auVar36,0x55);
        auVar36 = vfmadd213ps_fma(auVar36,auVar39,auVar82);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar36,auVar32,auVar111);
        auVar31 = vbroadcastss_avx512vl(auVar37);
        auVar36 = vshufps_avx512vl(auVar37,auVar37,0x55);
        auVar33 = vshufps_avx512vl(auVar37,auVar37,0xaa);
        auVar83._0_4_ = auVar33._0_4_ * fVar86;
        auVar83._4_4_ = auVar33._4_4_ * fVar53;
        auVar83._8_4_ = auVar33._8_4_ * fVar29;
        auVar83._12_4_ = auVar33._12_4_ * fVar85;
        auVar36 = vfmadd231ps_fma(auVar83,auVar39,auVar36);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vfmadd231ps_fma(auVar36,auVar32,auVar31);
        uVar84 = auVar30._0_4_;
        auVar112._4_4_ = uVar84;
        auVar112._0_4_ = uVar84;
        auVar112._8_4_ = uVar84;
        auVar112._12_4_ = uVar84;
        auVar36 = vshufps_avx(auVar30,auVar30,0x55);
        auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
        auVar94._0_4_ = auVar30._0_4_ * fVar86;
        auVar94._4_4_ = auVar30._4_4_ * fVar53;
        auVar94._8_4_ = auVar30._8_4_ * fVar29;
        auVar94._12_4_ = auVar30._12_4_ * fVar85;
        auVar36 = vfmadd231ps_fma(auVar94,auVar39,auVar36);
        auVar30 = vfmadd231ps_fma(auVar36,auVar32,auVar112);
        auVar36._0_4_ = auVar34._0_4_ + 0.0 + auVar30._0_4_;
        auVar36._4_4_ = auVar34._4_4_ + 0.0 + auVar30._4_4_;
        auVar36._8_4_ = auVar34._8_4_ + 0.0 + auVar30._8_4_;
        auVar36._12_4_ = auVar34._12_4_ + 0.0 + auVar30._12_4_;
      }
      else {
        if (iVar72 == 0x9134) {
          lVar23 = *plVar3;
          lVar25 = plVar3[2] * uVar22;
          auVar36 = vinsertps_avx(ZEXT416(*(uint *)(lVar23 + lVar25)),
                                  ZEXT416(*(uint *)(lVar23 + 0x10 + lVar25)),0x1c);
          auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)(lVar23 + 0x20 + lVar25)),0x28);
          auVar32 = vinsertps_avx(ZEXT416(*(uint *)(lVar23 + 4 + lVar25)),
                                  ZEXT416(*(uint *)(lVar23 + 0x14 + lVar25)),0x1c);
          auVar32 = vinsertps_avx(auVar32,ZEXT416(*(uint *)(lVar23 + 0x24 + lVar25)),0x28);
          auVar39 = vinsertps_avx(ZEXT416(*(uint *)(lVar23 + 8 + lVar25)),
                                  ZEXT416(*(uint *)(lVar23 + 0x18 + lVar25)),0x1c);
          auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(lVar23 + 0x28 + lVar25)),0x28);
          auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar23 + 0xc + lVar25)),
                                  ZEXT416(*(uint *)(lVar23 + 0x1c + lVar25)),0x1c);
          auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar23 + 0x2c + lVar25)),0x28);
        }
        else if (iVar72 == 0x9234) {
          lVar23 = *plVar3;
          lVar25 = plVar3[2] * uVar22;
          auVar75._8_8_ = 0;
          auVar75._0_8_ = *(ulong *)(lVar23 + 4 + lVar25);
          auVar89._8_8_ = 0;
          auVar89._0_8_ = *(ulong *)(lVar23 + 0x10 + lVar25);
          auVar36 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar23 + lVar25)),_DAT_02060e80,auVar75);
          auVar32 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar23 + 0xc + lVar25)),_DAT_02060e80,
                                       auVar89);
          auVar90._8_8_ = 0;
          auVar90._0_8_ = *(ulong *)(lVar23 + 0x1c + lVar25);
          auVar39 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar23 + 0x18 + lVar25)),_DAT_02060e80,
                                       auVar90);
          b0.field_0._8_8_ = 0;
          b0.field_0._0_8_ = *(ulong *)(lVar23 + 0x28 + lVar25);
          auVar33 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar23 + 0x24 + lVar25)),_DAT_02060e80,
                                       (undefined1  [16])b0.field_0);
          auVar31 = _DAT_02060e80;
        }
        else if (iVar72 == 0xb001) {
          lVar23 = *plVar3;
          lVar25 = plVar3[2] * uVar22;
          auVar56._8_8_ = 0;
          auVar56._0_8_ = *(ulong *)(lVar23 + 0x10 + lVar25);
          auVar31 = vinsertps_avx(auVar56,ZEXT416(*(uint *)(lVar23 + 8 + lVar25)),0x20);
          auVar57._8_8_ = 0;
          auVar57._0_8_ = *(ulong *)(lVar23 + 0x34 + lVar25);
          uVar52 = *(uint *)(lVar23 + 0xc + lVar25);
          auVar32 = vpermt2ps_avx512vl(auVar57,_DAT_02060e90,ZEXT416(*(uint *)(lVar23 + lVar25)));
          auVar106._8_8_ = 0;
          auVar106._0_8_ = *(ulong *)(lVar23 + 0x1c + lVar25);
          fVar53 = *(float *)(lVar23 + 0x24 + lVar25);
          auVar34 = ZEXT416((uint)fVar53);
          fVar29 = *(float *)(lVar23 + 0x28 + lVar25);
          auVar30 = ZEXT416((uint)fVar29);
          fVar85 = *(float *)(lVar23 + 0x2c + lVar25);
          auVar39 = vpermt2ps_avx512vl(auVar106,_DAT_02060e90,
                                       ZEXT416(*(uint *)(lVar23 + 0x18 + lVar25)));
          fVar113 = *(float *)(lVar23 + 0x30 + lVar25);
          auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar29)),ZEXT416((uint)fVar53),
                                    ZEXT416((uint)fVar53));
          auVar36 = vfmadd231ss_fma(auVar36,ZEXT416((uint)fVar85),ZEXT416((uint)fVar85));
          auVar36 = vfmadd231ss_fma(auVar36,ZEXT416((uint)fVar113),ZEXT416((uint)fVar113));
          auVar33 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar36._0_4_));
          fVar118 = auVar33._0_4_;
          fVar118 = fVar118 * 1.5 + fVar118 * fVar118 * fVar118 * auVar36._0_4_ * -0.5;
          auVar33 = vinsertps_avx(auVar39,ZEXT416((uint)(fVar118 * fVar53)),0x30);
          auVar36 = vinsertps_avx(auVar32,ZEXT416((uint)(fVar118 * fVar29)),0x30);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       ZEXT416((uint)(fVar85 * fVar118));
          auVar39 = vinsertps_avx(auVar31,ZEXT416((uint)(fVar118 * fVar113)),0x30);
          auVar31 = vinsertps_avx(ZEXT416(uVar52),ZEXT416(*(uint *)(lVar23 + 4 + lVar25)),0x10);
          auVar31 = vinsertps_avx(auVar31,ZEXT416(*(uint *)(lVar23 + 0x3c + lVar25)),0x20);
          auVar32 = vinsertps_avx(auVar31,ZEXT416((uint)(fVar85 * fVar118)),0x30);
          auVar31 = ZEXT416(uVar52);
        }
        else if (iVar72 == 0x9244) {
          lVar23 = *plVar3;
          lVar25 = plVar3[2] * uVar22;
          auVar36 = *(undefined1 (*) [16])(lVar23 + lVar25);
          auVar32 = *(undefined1 (*) [16])(lVar23 + 0x10 + lVar25);
          auVar39 = *(undefined1 (*) [16])(lVar23 + 0x20 + lVar25);
          auVar33 = *(undefined1 (*) [16])(lVar23 + 0x30 + lVar25);
        }
        lVar23 = (ulong)(iVar24 + 1) * 0x38;
        plVar3 = (long *)(lVar4 + lVar23);
        iVar72 = *(int *)(lVar4 + 0x20 + lVar23);
        if (iVar72 == 0x9134) {
          lVar4 = *plVar3;
          lVar23 = uVar22 * plVar3[2];
          auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + lVar23)),
                                  ZEXT416(*(uint *)(lVar4 + 0x10 + lVar23)),0x1c);
          auVar31 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar4 + 0x20 + lVar23)),0x28);
          auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 4 + lVar23)),
                                  ZEXT416(*(uint *)(lVar4 + 0x14 + lVar23)),0x1c);
          auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar4 + 0x24 + lVar23)),0x28);
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 8 + lVar23)),
                                  ZEXT416(*(uint *)(lVar4 + 0x18 + lVar23)),0x1c);
          auVar30 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(lVar4 + 0x28 + lVar23)),0x28);
          auVar73 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar23)),
                                  ZEXT416(*(uint *)(lVar4 + 0x1c + lVar23)),0x1c);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar73,ZEXT416(*(uint *)(lVar4 + 0x2c + lVar23)),0x28);
        }
        else if (iVar72 == 0x9234) {
          lVar4 = *plVar3;
          lVar23 = uVar22 * plVar3[2];
          auVar107._8_8_ = 0;
          auVar107._0_8_ = *(ulong *)(lVar4 + 4 + lVar23);
          auVar119._8_8_ = 0;
          auVar119._0_8_ = *(ulong *)(lVar4 + 0x10 + lVar23);
          auVar31 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + lVar23)),_DAT_02060e80,auVar107);
          auVar34 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0xc + lVar23)),_DAT_02060e80,
                                       auVar119);
          auVar108._8_8_ = 0;
          auVar108._0_8_ = *(ulong *)(lVar4 + 0x1c + lVar23);
          auVar30 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0x18 + lVar23)),_DAT_02060e80,
                                       auVar108);
          auVar130._8_8_ = 0;
          auVar130._0_8_ = *(ulong *)(lVar4 + 0x28 + lVar23);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0x24 + lVar23)),_DAT_02060e80,
                                          auVar130);
        }
        else if (iVar72 == 0xb001) {
          lVar4 = *plVar3;
          lVar23 = uVar22 * plVar3[2];
          auVar95._8_8_ = 0;
          auVar95._0_8_ = *(ulong *)(lVar4 + 0x10 + lVar23);
          auVar34 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(lVar4 + 8 + lVar23)),0x20);
          auVar96._8_8_ = 0;
          auVar96._0_8_ = *(ulong *)(lVar4 + 0x34 + lVar23);
          auVar31 = vpermt2ps_avx512vl(auVar96,_DAT_02060e90,ZEXT416(*(uint *)(lVar4 + lVar23)));
          auVar131._8_8_ = 0;
          auVar131._0_8_ = *(ulong *)(lVar4 + 0x1c + lVar23);
          fVar53 = *(float *)(lVar4 + 0x24 + lVar23);
          fVar29 = *(float *)(lVar4 + 0x28 + lVar23);
          fVar85 = *(float *)(lVar4 + 0x2c + lVar23);
          auVar73 = vpermt2ps_avx512vl(auVar131,_DAT_02060e90,
                                       ZEXT416(*(uint *)(lVar4 + 0x18 + lVar23)));
          fVar113 = *(float *)(lVar4 + 0x30 + lVar23);
          auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar29)),ZEXT416((uint)fVar53),
                                    ZEXT416((uint)fVar53));
          auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)fVar85),ZEXT416((uint)fVar85));
          auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)fVar113),ZEXT416((uint)fVar113));
          auVar136._4_12_ = ZEXT812(0) << 0x20;
          auVar136._0_4_ = auVar30._0_4_;
          auVar35 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar136);
          fVar118 = auVar35._0_4_;
          fVar118 = fVar118 * 1.5 + fVar118 * fVar118 * fVar118 * auVar30._0_4_ * -0.5;
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar73,ZEXT416((uint)(fVar53 * fVar118)),0x30);
          auVar31 = vinsertps_avx(auVar31,ZEXT416((uint)(fVar29 * fVar118)),0x30);
          auVar30 = vinsertps_avx(auVar34,ZEXT416((uint)(fVar118 * fVar113)),0x30);
          auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar23)),
                                  ZEXT416(*(uint *)(lVar4 + 4 + lVar23)),0x10);
          auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar4 + 0x3c + lVar23)),0x20);
          auVar34 = vinsertps_avx(auVar34,ZEXT416((uint)(fVar85 * fVar118)),0x30);
        }
        else if (iVar72 == 0x9244) {
          lVar4 = *plVar3;
          lVar23 = uVar22 * plVar3[2];
          auVar31 = *(undefined1 (*) [16])(lVar4 + lVar23);
          auVar34 = *(undefined1 (*) [16])(lVar4 + 0x10 + lVar23);
          auVar30 = *(undefined1 (*) [16])(lVar4 + 0x20 + lVar23);
          b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar4 + 0x30 + lVar23))->
                        v;
        }
        fVar53 = 1.0 - fVar86;
        auVar97._0_4_ = fVar86 * auVar31._0_4_;
        auVar97._4_4_ = fVar86 * auVar31._4_4_;
        auVar97._8_4_ = fVar86 * auVar31._8_4_;
        auVar97._12_4_ = fVar86 * auVar31._12_4_;
        auVar125._4_4_ = fVar53;
        auVar125._0_4_ = fVar53;
        auVar125._8_4_ = fVar53;
        auVar125._12_4_ = fVar53;
        a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vfmadd213ps_fma(auVar36,auVar125,auVar97);
        auVar98._0_4_ = fVar86 * auVar34._0_4_;
        auVar98._4_4_ = fVar86 * auVar34._4_4_;
        auVar98._8_4_ = fVar86 * auVar34._8_4_;
        auVar98._12_4_ = fVar86 * auVar34._12_4_;
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd213ps_fma(auVar32,auVar125,auVar98);
        auVar99._0_4_ = fVar86 * auVar30._0_4_;
        auVar99._4_4_ = fVar86 * auVar30._4_4_;
        auVar99._8_4_ = fVar86 * auVar30._8_4_;
        auVar99._12_4_ = fVar86 * auVar30._12_4_;
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vfmadd213ps_fma(auVar39,auVar125,auVar99);
        auVar100._0_4_ = fVar86 * b0.field_0._0_4_;
        auVar100._4_4_ = fVar86 * b0.field_0._4_4_;
        auVar100._8_4_ = fVar86 * b0.field_0._8_4_;
        auVar100._12_4_ = fVar86 * b0.field_0._12_4_;
        auVar36 = vfmadd213ps_fma(auVar33,auVar125,auVar100);
      }
    }
    auVar34 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xc9);
    auVar30 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xc9);
    auVar114._0_4_ = a0_1.field_0._0_4_ * auVar30._0_4_;
    auVar114._4_4_ = a0_1.field_0._4_4_ * auVar30._4_4_;
    auVar114._8_4_ = a0_1.field_0._8_4_ * auVar30._8_4_;
    auVar114._12_4_ = a0_1.field_0._12_4_ * auVar30._12_4_;
    auVar39 = vfmsub231ps_fma(auVar114,(undefined1  [16])a0.field_0,auVar34);
    auVar31 = vshufps_avx(auVar39,auVar39,0xc9);
    auVar32 = vshufps_avx((undefined1  [16])a0_2.field_0,(undefined1  [16])a0_2.field_0,0xc9);
    auVar101._0_4_ = a0_2.field_0._0_4_ * auVar34._0_4_;
    auVar101._4_4_ = a0_2.field_0._4_4_ * auVar34._4_4_;
    auVar101._8_4_ = a0_2.field_0._8_4_ * auVar34._8_4_;
    auVar101._12_4_ = a0_2.field_0._12_4_ * auVar34._12_4_;
    auVar33 = vfmsub231ps_fma(auVar101,auVar32,(undefined1  [16])a0_1.field_0);
    auVar64._0_4_ = auVar32._0_4_ * a0.field_0._0_4_;
    auVar64._4_4_ = auVar32._4_4_ * a0.field_0._4_4_;
    auVar64._8_4_ = auVar32._8_4_ * a0.field_0._8_4_;
    auVar64._12_4_ = auVar32._12_4_ * a0.field_0._12_4_;
    auVar30 = vfmsub231ps_fma(auVar64,(undefined1  [16])a0_2.field_0,auVar30);
    auVar34 = vshufps_avx(auVar30,auVar30,0xc9);
    auVar32 = vunpcklps_avx(auVar31,auVar34);
    auVar34 = vunpcklps_avx(auVar39,auVar30);
    auVar30 = vinsertps_avx(auVar33,auVar33,0x4a);
    auVar39 = vunpcklps_avx(auVar34,ZEXT416(auVar33._0_4_));
    auVar34 = vdpps_avx((undefined1  [16])a0_2.field_0,auVar31,0x7f);
    auVar31 = vunpcklps_avx(auVar32,auVar30);
    auVar30 = vunpckhps_avx(auVar32,auVar30);
    auVar58._0_4_ = auVar34._0_4_;
    auVar58._4_4_ = auVar58._0_4_;
    auVar58._8_4_ = auVar58._0_4_;
    auVar58._12_4_ = auVar58._0_4_;
    auVar34 = vdivps_avx(auVar31,auVar58);
    auVar30 = vdivps_avx(auVar30,auVar58);
    auVar31 = vdivps_avx(auVar39,auVar58);
    uVar84 = auVar36._0_4_;
    auVar65._4_4_ = uVar84;
    auVar65._0_4_ = uVar84;
    auVar65._8_4_ = uVar84;
    auVar65._12_4_ = uVar84;
    auVar32 = vshufps_avx(auVar36,auVar36,0x55);
    auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
    auVar91._0_4_ = auVar36._0_4_ * auVar31._0_4_;
    auVar91._4_4_ = auVar36._4_4_ * auVar31._4_4_;
    auVar91._8_4_ = auVar36._8_4_ * auVar31._8_4_;
    auVar91._12_4_ = auVar36._12_4_ * auVar31._12_4_;
    auVar36 = vfmadd231ps_fma(auVar91,auVar30,auVar32);
    auVar36 = vfmadd231ps_fma(auVar36,auVar34,auVar65);
    uVar6 = *(undefined8 *)&(ray->super_RayK<1>).org.field_0;
    uVar17 = *(undefined8 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    uVar18 = *(undefined8 *)&(ray->super_RayK<1>).dir.field_0;
    uVar19 = *(undefined8 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
    uVar84 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    auVar10._4_4_ = uVar84;
    auVar10._0_4_ = uVar84;
    auVar10._8_4_ = uVar84;
    auVar10._12_4_ = uVar84;
    auVar36 = vfmsub231ps_avx512vl(auVar36,auVar31,auVar10);
    uVar84 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    auVar11._4_4_ = uVar84;
    auVar11._0_4_ = uVar84;
    auVar11._8_4_ = uVar84;
    auVar11._12_4_ = uVar84;
    auVar36 = vfmadd231ps_avx512vl(auVar36,auVar30,auVar11);
    uVar84 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    auVar12._4_4_ = uVar84;
    auVar12._0_4_ = uVar84;
    auVar12._8_4_ = uVar84;
    auVar12._12_4_ = uVar84;
    auVar36 = vfmadd231ps_avx512vl(auVar36,auVar34,auVar12);
    aVar5 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
            vinsertps_avx(auVar36,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]),0x30);
    (ray->super_RayK<1>).org.field_0 = aVar5;
    uVar84 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
    auVar13._4_4_ = uVar84;
    auVar13._0_4_ = uVar84;
    auVar13._8_4_ = uVar84;
    auVar13._12_4_ = uVar84;
    auVar36 = vmulps_avx512vl(auVar31,auVar13);
    uVar84 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    auVar14._4_4_ = uVar84;
    auVar14._0_4_ = uVar84;
    auVar14._8_4_ = uVar84;
    auVar14._12_4_ = uVar84;
    auVar36 = vfmadd231ps_avx512vl(auVar36,auVar30,auVar14);
    uVar84 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    auVar15._4_4_ = uVar84;
    auVar15._0_4_ = uVar84;
    auVar15._8_4_ = uVar84;
    auVar15._12_4_ = uVar84;
    auVar36 = vfmadd231ps_avx512vl(auVar36,auVar34,auVar15);
    aVar5 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
            vinsertps_avx(auVar36,ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[3]),0x30);
    (ray->super_RayK<1>).dir.field_0 = aVar5;
    (**(code **)(p_Var26 + 0x78))(p_Var26 + 0x58,ray);
    *(undefined8 *)&(ray->super_RayK<1>).org.field_0 = uVar6;
    *(undefined8 *)((long)&(ray->super_RayK<1>).org.field_0 + 8) = uVar17;
    *(undefined8 *)&(ray->super_RayK<1>).dir.field_0 = uVar18;
    *(undefined8 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8) = uVar19;
    pRVar2->instID[0] = 0xffffffff;
    pRVar2->instPrimID[0] = 0xffffffff;
  }
  return;
}

Assistant:

void InstanceArrayIntersector1MB::intersect(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, ray.time());
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.intersect((RTCRayHit&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }